

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletutil.cpp
# Opt level: O2

WalletDescriptor *
wallet::GenerateWalletDescriptor
          (WalletDescriptor *__return_storage_ptr__,CExtPubKey *master_key,OutputType *addr_type,
          bool internal)

{
  long lVar1;
  uint __line;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  CChainParams *pCVar3;
  reference __r;
  char *pcVar4;
  long in_FS_OFFSET;
  shared_ptr<Descriptor> descriptor;
  int32_t in_stack_fffffffffffffde8;
  element_type local_210;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_208;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  desc;
  FlatSigningProvider keys;
  string error;
  string desc_str;
  string internal_path;
  string desc_suffix;
  string desc_prefix;
  string xpub;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)GetTime();
  EncodeExtPubKey_abi_cxx11_(&xpub,master_key);
  desc_prefix._M_dataplus._M_p = (pointer)&desc_prefix.field_2;
  desc_prefix._M_string_length = 0;
  desc_prefix.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&desc_suffix,"/*)",(allocator<char> *)&keys);
  switch(*addr_type) {
  case LEGACY:
    std::operator+(&internal_path,"pkh(",&xpub);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys,
                   &internal_path,"/44h");
    break;
  case P2SH_SEGWIT:
    std::operator+(&internal_path,"sh(wpkh(",&xpub);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys,
                   &internal_path,"/49h");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&desc_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys);
    std::__cxx11::string::~string((string *)&keys);
    std::__cxx11::string::~string((string *)&internal_path);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&desc_suffix,")");
    goto switchD_009c6989_default;
  case BECH32:
    std::operator+(&internal_path,"wpkh(",&xpub);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys,
                   &internal_path,"/84h");
    break;
  case BECH32M:
    std::operator+(&internal_path,"tr(",&xpub);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys,
                   &internal_path,"/86h");
    break;
  case UNKNOWN:
    pcVar4 = "false";
    __line = 0x4f;
    goto LAB_009c6d46;
  default:
    goto switchD_009c6989_default;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&desc_prefix,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys
            );
  std::__cxx11::string::~string((string *)&keys);
  std::__cxx11::string::~string((string *)&internal_path);
switchD_009c6989_default:
  if (desc_prefix._M_string_length != 0) {
    pCVar3 = Params();
    pcVar4 = "/1h";
    if (pCVar3->m_chain_type == MAIN) {
      pcVar4 = "/0h";
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&desc_prefix,pcVar4);
    pcVar4 = "/0";
    if (internal) {
      pcVar4 = "/1";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&internal_path,pcVar4,(allocator<char> *)&keys);
    std::operator+(&error,&desc_prefix,"/0h");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys,&error
                   ,&internal_path);
    std::operator+(&desc_str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys,
                   &desc_suffix);
    std::__cxx11::string::~string((string *)&keys);
    std::__cxx11::string::~string((string *)&error);
    keys.super_SigningProvider._vptr_SigningProvider =
         (_func_int **)&PTR__FlatSigningProvider_0114ae68;
    keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
    keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    keys.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
    keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &keys.origins._M_t._M_impl.super__Rb_tree_header._M_header;
    keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    keys.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &keys.keys._M_t._M_impl.super__Rb_tree_header._M_header;
    keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    keys.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
    keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    error._M_dataplus._M_p = (pointer)&error.field_2;
    error._M_string_length = 0;
    error.field_2._M_local_buf[0] = '\0';
    keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Parse(&desc,&desc_str,&keys,&error,false);
    __r = std::
          vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
          ::at(&desc,0);
    std::__shared_ptr<Descriptor,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Descriptor,std::default_delete<Descriptor>,void>
              ((__shared_ptr<Descriptor,(__gnu_cxx::_Lock_policy)2> *)&local_210,__r);
    descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_210;
    WalletDescriptor::WalletDescriptor
              (__return_storage_ptr__,descriptor,0,0,0,in_stack_fffffffffffffde8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_208);
    std::
    vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    ::~vector(&desc);
    std::__cxx11::string::~string((string *)&error);
    FlatSigningProvider::~FlatSigningProvider(&keys);
    std::__cxx11::string::~string((string *)&desc_str);
    std::__cxx11::string::~string((string *)&internal_path);
    std::__cxx11::string::~string((string *)&desc_suffix);
    std::__cxx11::string::~string((string *)&desc_prefix);
    std::__cxx11::string::~string((string *)&xpub);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
      __stack_chk_fail();
    }
    return __return_storage_ptr__;
  }
  pcVar4 = "!desc_prefix.empty()";
  __line = 0x52;
LAB_009c6d46:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletutil.cpp"
                ,__line,
                "WalletDescriptor wallet::GenerateWalletDescriptor(const CExtPubKey &, const OutputType &, bool)"
               );
}

Assistant:

WalletDescriptor GenerateWalletDescriptor(const CExtPubKey& master_key, const OutputType& addr_type, bool internal)
{
    int64_t creation_time = GetTime();

    std::string xpub = EncodeExtPubKey(master_key);

    // Build descriptor string
    std::string desc_prefix;
    std::string desc_suffix = "/*)";
    switch (addr_type) {
    case OutputType::LEGACY: {
        desc_prefix = "pkh(" + xpub + "/44h";
        break;
    }
    case OutputType::P2SH_SEGWIT: {
        desc_prefix = "sh(wpkh(" + xpub + "/49h";
        desc_suffix += ")";
        break;
    }
    case OutputType::BECH32: {
        desc_prefix = "wpkh(" + xpub + "/84h";
        break;
    }
    case OutputType::BECH32M: {
        desc_prefix = "tr(" + xpub + "/86h";
        break;
    }
    case OutputType::UNKNOWN: {
        // We should never have a DescriptorScriptPubKeyMan for an UNKNOWN OutputType,
        // so if we get to this point something is wrong
        assert(false);
    }
    } // no default case, so the compiler can warn about missing cases
    assert(!desc_prefix.empty());

    // Mainnet derives at 0', testnet and regtest derive at 1'
    if (Params().IsTestChain()) {
        desc_prefix += "/1h";
    } else {
        desc_prefix += "/0h";
    }

    std::string internal_path = internal ? "/1" : "/0";
    std::string desc_str = desc_prefix + "/0h" + internal_path + desc_suffix;

    // Make the descriptor
    FlatSigningProvider keys;
    std::string error;
    std::vector<std::unique_ptr<Descriptor>> desc = Parse(desc_str, keys, error, false);
    WalletDescriptor w_desc(std::move(desc.at(0)), creation_time, 0, 0, 0);
    return w_desc;
}